

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O1

int sexp_reset_weak_references(sexp_conflict ctx)

{
  byte *pbVar1;
  char *pcVar2;
  sexp_uint_t sVar3;
  char *pcVar4;
  sexp_free_list psVar5;
  ulong uVar6;
  sexp psVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  sexp_heap_conflict psVar13;
  ulong uVar14;
  sexp_free_list psVar15;
  sexp_free_list_conflict psVar16;
  sexp_uint_t sVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  auVar11 = _DAT_0012f010;
  auVar10 = _DAT_0012f000;
  iVar12 = 0;
  if (((((ctx->value).type.setters)->value).context.mark_stack[7].start != (sexp_conflict *)0x3e) &&
     (psVar13 = (ctx->value).context.heap, psVar13 != (sexp_heap_conflict)0x0)) {
    iVar12 = 0;
    do {
      sVar3 = psVar13->size;
      if (0x20 < (long)sVar3) {
        pcVar4 = psVar13->data;
        psVar15 = (sexp_free_list)(pcVar4 + 0x20);
        psVar5 = psVar13->free_list;
LAB_0010c562:
        do {
          psVar16 = psVar5;
          psVar5 = psVar16->next;
          if (psVar5 != (sexp_free_list)0x0) {
            if (psVar5 < psVar15) goto LAB_0010c562;
          }
          if (psVar5 == psVar15) {
            sVar17 = psVar5->size;
          }
          else {
            if (*(char *)((long)&psVar15->size + 4) != '\0') {
              lVar19 = *(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                                (ulong)(uint)psVar15->size * 8 + 8);
              lVar21 = (long)*(short *)(lVar19 + 100);
              if (0 < lVar21) {
                uVar18 = (int)*(short *)(lVar19 + 0x66) +
                         (int)*(short *)(lVar19 + 0x6a) *
                         (int)*(undefined8 *)
                               ((long)&psVar15->size + (long)*(short *)(lVar19 + 0x68));
                if ((int)uVar18 < 1) {
                  bVar8 = false;
                  uVar14 = 0;
                }
                else {
                  uVar14 = 0;
                  bVar9 = true;
                  do {
                    uVar6 = *(ulong *)((long)&psVar15->size + uVar14 * 8 + lVar21);
                    bVar8 = false;
                    if (((uVar6 & 3) == 0 && uVar6 != 0) && (*(char *)(uVar6 + 4) == '\0')) {
                      pcVar2 = (char *)((long)&psVar15->size + uVar14 * 8 + lVar21);
                      pcVar2[0] = '>';
                      pcVar2[1] = '\0';
                      pcVar2[2] = '\0';
                      pcVar2[3] = '\0';
                      pcVar2[4] = '\0';
                      pcVar2[5] = '\0';
                      pcVar2[6] = '\0';
                      pcVar2[7] = '\0';
                      pbVar1 = (byte *)((long)&psVar15->size + 5);
                      *pbVar1 = *pbVar1 | 4;
                      bVar8 = bVar9;
                    }
                    uVar14 = uVar14 + 1;
                    bVar9 = bVar8;
                  } while (uVar14 < (uVar18 & 0x7fffffff));
                  bVar8 = !bVar8;
                }
                if (!bVar8) {
                  iVar12 = iVar12 + 1;
                  lVar19 = (long)(int)uVar18 + (long)*(short *)(lVar19 + 0x6c);
                  if ((int)uVar14 < (int)lVar19) {
                    lVar19 = lVar19 - (uVar14 & 0xffffffff);
                    lVar20 = lVar19 + -1;
                    auVar22._8_4_ = (int)lVar20;
                    auVar22._0_8_ = lVar20;
                    auVar22._12_4_ = (int)((ulong)lVar20 >> 0x20);
                    lVar21 = lVar21 + (uVar14 & 0xffffffff) * 8;
                    auVar22 = auVar22 ^ auVar11;
                    uVar14 = 0;
                    do {
                      auVar23._8_4_ = (int)uVar14;
                      auVar23._0_8_ = uVar14;
                      auVar23._12_4_ = (int)(uVar14 >> 0x20);
                      auVar23 = (auVar23 | auVar10) ^ auVar11;
                      if ((bool)(~(auVar22._4_4_ < auVar23._4_4_ ||
                                  auVar22._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar22._4_4_) &
                                1)) {
                        pcVar2 = (char *)((long)&psVar15->size + uVar14 * 8 + lVar21);
                        pcVar2[0] = '>';
                        pcVar2[1] = '\0';
                        pcVar2[2] = '\0';
                        pcVar2[3] = '\0';
                        pcVar2[4] = '\0';
                        pcVar2[5] = '\0';
                        pcVar2[6] = '\0';
                        pcVar2[7] = '\0';
                      }
                      if (auVar23._12_4_ <= auVar22._12_4_ &&
                          (auVar23._8_4_ <= auVar22._8_4_ || auVar23._12_4_ != auVar22._12_4_)) {
                        *(undefined8 *)((long)&psVar15->next + uVar14 * 8 + lVar21) = 0x3e;
                      }
                      uVar14 = uVar14 + 2;
                    } while ((lVar19 + 1U & 0xfffffffffffffffe) != uVar14);
                  }
                }
              }
            }
            sVar17 = 0x20;
            if (((ulong)psVar15 & 3) == 0) {
              uVar14 = (ulong)(uint)psVar15->size;
              psVar7 = (ctx->value).type.setters;
              if ((long)uVar14 < (long)(psVar7->value).type.id >> 1) {
                lVar21 = *(long *)((long)&((psVar7->value).type.getters)->value + uVar14 * 8 + 8);
                sVar17 = (ulong)*(ushort *)(lVar21 + 0x62) *
                         *(long *)((long)&psVar15->size + (long)*(short *)(lVar21 + 0x60)) +
                         (long)*(short *)(lVar21 + 0x5e) + 0x1f & 0xffffffffffffffe0;
              }
            }
          }
          psVar15 = (sexp_free_list)((long)&psVar15->size + sVar17);
          psVar5 = psVar16;
        } while (psVar15 < (sexp_free_list)(pcVar4 + sVar3));
      }
      psVar13 = psVar13->next;
    } while (psVar13 != (sexp_heap)0x0);
  }
  return iVar12;
}

Assistant:

int sexp_reset_weak_references(sexp ctx) {
  int i, len, broke, all_reset_p;
  sexp_heap h;
  sexp p, t, end, *v;
  sexp_free_list q, r;
  if (sexp_not(sexp_global(ctx, SEXP_G_WEAK_OBJECTS_PRESENT)))
    return 0;
  broke = 0;
  /* just scan the whole heap */
  for (h = sexp_context_heap(ctx) ; h; h=h->next) {
    p = sexp_heap_first_block(h);
    q = h->free_list;
    end = sexp_heap_end(h);
    while (p < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip it */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      if (sexp_valid_object_p(ctx, p) && sexp_markedp(p)) {
        t = sexp_object_type(ctx, p);
        if (sexp_type_weak_base(t) > 0) {
          all_reset_p = 1;
          v = (sexp*) ((char*)p + sexp_type_weak_base(t));
          len = sexp_type_num_weak_slots_of_object(t, p);
          for (i=0; i<len; i++) {
            if (v[i] && sexp_pointerp(v[i]) && ! sexp_markedp(v[i])) {
              v[i] = SEXP_FALSE;
              sexp_brokenp(p) = 1;
            } else {
              all_reset_p = 0;
            }
          }
          if (all_reset_p) {      /* ephemerons */
            broke++;
            len += sexp_type_weak_len_extra(t);
            for ( ; i<len; i++) v[i] = SEXP_FALSE;
          }
        }
      }
      p = (sexp) (((char*)p)+sexp_heap_align(sexp_allocated_bytes(ctx, p)));
    }
  }
  sexp_debug_printf("%p (broke %d weak references)", ctx, broke);
  return broke;
}